

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O0

int rnd_defensive_item(monst *mtmp)

{
  permonst *ptr;
  boolean bVar1;
  int iVar2;
  int iVar3;
  int local_28;
  int trycnt;
  int difficulty;
  permonst *pm;
  monst *mtmp_local;
  
  ptr = mtmp->data;
  iVar2 = monsndx(ptr);
  iVar2 = monstr[iVar2];
  local_28 = 0;
  if (((((ptr->mflags1 & 0x40000) != 0) || (bVar1 = attacktype(ptr,0xd), bVar1 != '\0')) ||
      ((mtmp->data->mflags1 & 0x10000) != 0)) || ((ptr->mlet == '6' || (ptr->mlet == '%')))) {
    return 0;
  }
LAB_00266060:
  iVar3 = rn2((8 < iVar2) + 8 + (uint)(3 < iVar2) + (uint)(6 < iVar2));
  switch(iVar3) {
  case 0:
  case 1:
    goto LAB_002661ce;
  case 2:
    return 0x158;
  case 3:
    return 0x131;
  case 4:
    return 0x136;
  case 5:
    if (mtmp->data != mons + 0x145) {
      return 300;
    }
    return 0x13f;
  case 6:
  case 9:
    break;
  case 7:
    if (((ptr->mlet != '\x05') && ((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) == 0)) &&
       (((*(uint *)&mtmp->field_0x60 >> 0x1b & 1) == 0 &&
        ((*(uint *)&mtmp->field_0x60 >> 0x1c & 1) == 0)))) {
      return 0x1cf;
    }
    return 0;
  case 8:
  case 10:
    iVar2 = rn2(3);
    if (iVar2 != 0) {
      return 0x158;
    }
    return 0x1c1;
  default:
    return 0;
  }
  if (((*(uint *)&(mtmp->dlevel->flags).field_0x8 >> 0xb & 1) == 0) ||
     (local_28 = local_28 + 1, 1 < local_28)) {
    iVar2 = rn2(3);
    if (iVar2 == 0) {
      return 0x1cb;
    }
LAB_002661ce:
    return 0x15c;
  }
  goto LAB_00266060;
}

Assistant:

int rnd_defensive_item(struct monst *mtmp)
{
	const struct permonst *pm = mtmp->data;
	int difficulty = monstr[monsndx(pm)];
	int trycnt = 0;

	if (is_animal(pm) || attacktype(pm, AT_EXPL) || mindless(mtmp->data)
			|| pm->mlet == S_GHOST || pm->mlet == S_KOP)
	    return 0;
try_again:
	switch (rn2(8 + (difficulty > 3) + (difficulty > 6) +
				(difficulty > 8))) {
		case 6: case 9:
			if (mtmp->dlevel->flags.noteleport && ++trycnt < 2)
			    goto try_again;
			if (!rn2(3)) return WAN_TELEPORTATION;
			/* else FALLTHRU */
		case 0: case 1:
			return SCR_TELEPORTATION;
		case 8: case 10:
			if (!rn2(3)) return WAN_CREATE_MONSTER;
			/* else FALLTHRU */
		case 2: return SCR_CREATE_MONSTER;
		case 3: return POT_HEALING;
		case 4: return POT_EXTRA_HEALING;
		case 5: return (mtmp->data != &mons[PM_PESTILENCE]) ?
				POT_FULL_HEALING : POT_SICKNESS;
		case 7: if (is_floater(pm) || mtmp->isshk || mtmp->isgd
						|| mtmp->ispriest
									)
				return 0;
			else
				return WAN_DIGGING;
	}
	/*NOTREACHED*/
	return 0;
}